

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_23::Struct2Local::adjustTypeFlowingThrough(Struct2Local *this,Expression *curr)

{
  long *plVar1;
  ulong uVar2;
  HeapType HVar3;
  ulong in_RDX;
  __hash_code __code;
  
  plVar1 = *(long **)((long)((this->
                             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                             ).
                             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                             .stack.fixed._M_elems + -1) + (in_RDX % (ulong)curr) * 8);
  if (plVar1 != (long *)0x0) {
    plVar1 = (long *)*plVar1;
    uVar2 = plVar1[1];
    while (uVar2 != in_RDX) {
      plVar1 = (long *)*plVar1;
      if (plVar1 == (long *)0x0) {
        return;
      }
      uVar2 = plVar1[1];
      if (uVar2 % (ulong)curr != in_RDX % (ulong)curr) {
        return;
      }
    }
    if ((char)plVar1[2] == '\x02') {
      if ((*(ulong *)(in_RDX + 8) < 7) || ((*(ulong *)(in_RDX + 8) & 1) != 0)) {
        __assert_fail("curr->type.isRef()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x27d,
                      "void wasm::(anonymous namespace)::Struct2Local::adjustTypeFlowingThrough(Expression *)"
                     );
      }
      HVar3 = wasm::Type::getHeapType((Type *)(in_RDX + 8));
      if (((uint)(0x7c < HVar3.id) * 4 + 3 & (uint)HVar3.id) != 0) {
        __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
      }
      ((Type *)(in_RDX + 8))->id = HVar3.id | 2;
    }
  }
  return;
}

Assistant:

void adjustTypeFlowingThrough(Expression* curr) {
    if (analyzer.getInteraction(curr) != ParentChildInteraction::Flows) {
      return;
    }

    // Our allocation passes through this expr. We must turn its type into a
    // nullable one, because we will remove things like RefAsNonNull of it,
    // which means we may no longer have a non-nullable value as our input,
    // and we could fail to validate. It is safe to make this change in terms
    // of our parent, since we know very specifically that only safe things
    // will end up using our value, like a StructGet or a Drop, which do not
    // care about non-nullability.
    assert(curr->type.isRef());
    curr->type = Type(curr->type.getHeapType(), Nullable);
  }